

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O1

void __thiscall
cfd::js::api::json::SchnorrSignRequest::ConvertFromStruct
          (SchnorrSignRequest *this,SchnorrSignRequestStruct *data)

{
  std::__cxx11::string::_M_assign((string *)&this->privkey_);
  std::__cxx11::string::_M_assign((string *)&this->message_);
  this->is_hashed_ = data->is_hashed;
  std::__cxx11::string::_M_assign((string *)&this->nonce_or_aux_);
  this->is_nonce_ = data->is_nonce;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void SchnorrSignRequest::ConvertFromStruct(
    const SchnorrSignRequestStruct& data) {
  privkey_ = data.privkey;
  message_ = data.message;
  is_hashed_ = data.is_hashed;
  nonce_or_aux_ = data.nonce_or_aux;
  is_nonce_ = data.is_nonce;
  ignore_items = data.ignore_items;
}